

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

char ** event_get_supported_methods(void)

{
  char **ppcVar1;
  char **ppcVar2;
  long lVar3;
  
  ppcVar2 = (char **)event_mm_calloc_(4,8);
  ppcVar1 = event_get_supported_methods::methods;
  if (ppcVar2 != (char **)0x0) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)ppcVar2 + lVar3) = **(undefined8 **)((long)eventops + lVar3);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    ppcVar2[3] = (char *)0x0;
    ppcVar1 = ppcVar2;
    if (event_get_supported_methods::methods != (char **)0x0) {
      if (mm_free_fn_ == (_func_void_void_ptr *)0x0) {
        free(event_get_supported_methods::methods);
      }
      else {
        (*mm_free_fn_)(event_get_supported_methods::methods);
      }
    }
  }
  event_get_supported_methods::methods = ppcVar1;
  return ppcVar2;
}

Assistant:

const char **
event_get_supported_methods(void)
{
	static const char **methods = NULL;
	const struct eventop **method;
	const char **tmp;
	int i = 0, k;

	/* count all methods */
	for (method = &eventops[0]; *method != NULL; ++method) {
		++i;
	}

	/* allocate one more than we need for the NULL pointer */
	tmp = mm_calloc((i + 1), sizeof(char *));
	if (tmp == NULL)
		return (NULL);

	/* populate the array with the supported methods */
	for (k = 0, i = 0; eventops[k] != NULL; ++k) {
		tmp[i++] = eventops[k]->name;
	}
	tmp[i] = NULL;

	if (methods != NULL)
		mm_free((char**)methods);

	methods = tmp;

	return (methods);
}